

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_map.cc
# Opt level: O2

int bloaty::sourcemap::ReadBase64VLQSegment(string_view *data,int32_t (*values) [5])

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  Arg *pAVar7;
  Arg *a0;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  string_view format;
  string_view format_00;
  string local_68;
  Arg local_48;
  
  sVar5 = data->_M_len;
  a0 = (Arg *)data->_M_str;
  uVar2 = 0;
  do {
    if (uVar2 == 5) {
      pcVar6 = "Unterminated Base64VLQ segment";
      iVar9 = 0x6c;
LAB_001859e0:
      Throw(pcVar6,iVar9);
    }
    lVar1 = sVar5 - 0x10;
    pcVar6 = a0->scratch_;
    bVar3 = 0;
    uVar8 = 0;
    pAVar7 = a0;
    while( true ) {
      sVar5 = sVar5 - 1;
      a0 = (Arg *)((long)&(pAVar7->piece_)._M_len + 1);
      if ((Arg *)(pcVar6 + lVar1) <= pAVar7) {
        pcVar6 = "Unterminated Base64VLQ";
        iVar9 = 0x5a;
        goto LAB_001859e0;
      }
      local_48.scratch_[0] = (char)(pAVar7->piece_)._M_len;
      iVar9 = (int)local_48.scratch_[0];
      if (((byte)(local_48.scratch_[0] + 0xbfU) < 0x1a) ||
         ((byte)(local_48.scratch_[0] + 0x9fU) < 6)) break;
      if ((byte)(local_48.scratch_[0] + 0x99U) < 0x14) {
        uVar10 = iVar9 - 0x67;
      }
      else {
        if ((byte)(local_48.scratch_[0] - 0x3aU) < 0xf5 && local_48.scratch_[0] != 0x2b) {
          local_48.piece_._M_str = local_48.scratch_;
          local_48.piece_._M_len = 1;
          format._M_str = (char *)&local_48;
          format._M_len = (size_t)"Invalid Base64VLQ digit $0";
          absl::Substitute_abi_cxx11_(&local_68,(absl *)0x1a,format,a0);
          Throw(local_68._M_dataplus._M_p,0x50);
        }
        if ((byte)local_48.scratch_[0] < 0x30) {
          uVar10 = local_48.scratch_[0] == 0x2b ^ 0x1f;
        }
        else {
          uVar10 = iVar9 - 0x1c;
        }
      }
      uVar8 = uVar8 | uVar10 << (bVar3 & 0x1f);
      bVar3 = bVar3 + 5;
      pAVar7 = a0;
    }
    iVar11 = iVar9 + -0x41;
    if (0x60 < (byte)local_48.scratch_[0]) {
      iVar11 = iVar9 + -0x47;
    }
    uVar8 = iVar11 << (bVar3 & 0x1f) | uVar8;
    data->_M_str = (char *)a0;
    data->_M_len = sVar5;
    uVar4 = uVar8 >> 1;
    uVar10 = -uVar4;
    if ((uVar8 & 1) == 0) {
      uVar10 = uVar4;
    }
    (*values)[uVar2] = uVar10;
    if ((sVar5 == 0) ||
       ((bVar3 = (byte)(a0->piece_)._M_len, 0x19 < (byte)((bVar3 & 0xdf) + 0xbf) &&
        (10 < (byte)(bVar3 - 0x2f) && bVar3 != 0x2b)))) {
      if ((uVar2 & 3) == 0 || uVar2 == 3) {
        return (int)uVar2 + 1;
      }
      absl::substitute_internal::Arg::Arg(&local_48,(int)uVar2 + 1);
      format_00._M_str = (char *)&local_48;
      format_00._M_len = (size_t)"Invalid source map VLQ segment length $0";
      absl::Substitute_abi_cxx11_(&local_68,(absl *)0x28,format_00,a0);
      Throw(local_68._M_dataplus._M_p,0x67);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static int ReadBase64VLQSegment(std::string_view* data, int32_t (&values)[5]) {
  for (int i = 0; i < 5; i++) {
    values[i] = ReadBase64VLQ(data);
    if (data->empty() || !IsBase64Digit(data->front())) {
      if (i != 0 && i != 3 && i != 4) {
        THROWF("Invalid source map VLQ segment length $0", i + 1);
      }
      return i + 1;
    }
  }
  THROW("Unterminated Base64VLQ segment");
}